

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

void Assimp::FBX::ParseVectorDataArray
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *out,Element *el)

{
  Token *t;
  pointer ppTVar1;
  char *end;
  size_t __n;
  Scope *sc;
  Element *pEVar2;
  int iVar3;
  Element *in_R9;
  pointer ppTVar4;
  double *pdVar5;
  float *pfVar6;
  float fVar7;
  char type;
  aiVector3t<float> local_68;
  vector<char,_std::allocator<char>_> buff;
  char *data;
  uint32_t count;
  ulong __n_00;
  
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize(out,0);
  ppTVar4 = (el->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar4 ==
      (el->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buff,"unexpected empty element",(allocator<char> *)&local_68);
    anon_unknown.dwarf_cefc03::ParseError((string *)&buff,el);
  }
  t = *ppTVar4;
  if (t->column == 0xffffffff) {
    data = t->sbegin;
    end = t->send;
    anon_unknown_20::ReadBinaryDataArrayHead(&data,end,&type,&count,el);
    __n_00 = (ulong)count / 3;
    if (count % 3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buff,"number of floats is not a multiple of three (3) (binary)",
                 (allocator<char> *)&local_68);
      anon_unknown.dwarf_cefc03::ParseError((string *)&buff,el);
    }
    if (count != 0) {
      if ((type & 0xfdU) != 100) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buff,"expected float or double array (binary)",
                   (allocator<char> *)&local_68);
        anon_unknown.dwarf_cefc03::ParseError((string *)&buff,el);
      }
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      anon_unknown_20::ReadBinaryDataArray(type,count,&data,end,&buff,in_R9);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(out,__n_00);
      if (type == 'f') {
        pfVar6 = (float *)(buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start + 8);
        while (iVar3 = (int)__n_00, __n_00 = (ulong)(iVar3 - 1), iVar3 != 0) {
          local_68.z = *pfVar6;
          local_68.x = pfVar6[-2];
          local_68.y = pfVar6[-1];
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          emplace_back<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)out,&local_68);
          pfVar6 = pfVar6 + 3;
        }
      }
      else if (type == 'd') {
        pdVar5 = (double *)
                 (buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + 0x10);
        while (iVar3 = (int)__n_00, __n_00 = (ulong)(iVar3 - 1), iVar3 != 0) {
          local_68.z = (float)*pdVar5;
          local_68.x = (float)pdVar5[-2];
          local_68.y = (float)pdVar5[-1];
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          emplace_back<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)out,&local_68);
          pdVar5 = pdVar5 + 3;
        }
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&buff.super__Vector_base<char,_std::allocator<char>_>);
    }
  }
  else {
    __n = ParseTokenAsDim(t);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(out,__n);
    sc = GetRequiredScope(el);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buff,"a",(allocator<char> *)&local_68);
    pEVar2 = GetRequiredElement(sc,(string *)&buff,el);
    std::__cxx11::string::~string((string *)&buff);
    ppTVar4 = (pEVar2->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar1 = (pEVar2->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppTVar1 - (long)ppTVar4 >> 3) % 3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buff,"number of floats is not a multiple of three (3)",
                 (allocator<char> *)&local_68);
      anon_unknown.dwarf_cefc03::ParseError((string *)&buff,el);
    }
    for (; ppTVar4 != ppTVar1; ppTVar4 = ppTVar4 + 3) {
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)((ulong)buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish & 0xffffffff00000000);
      fVar7 = ParseTokenAsFloat(*ppTVar4);
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)CONCAT44(buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,fVar7);
      fVar7 = ParseTokenAsFloat(ppTVar4[1]);
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)CONCAT44(fVar7,buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_);
      fVar7 = ParseTokenAsFloat(ppTVar4[2]);
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)CONCAT44(buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_finish._4_4_,fVar7);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (out,(value_type *)&buff);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<aiVector3D>& out, const Element& el)
{
    out.resize( 0 );

    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(count % 3 != 0) {
            ParseError("number of floats is not a multiple of three (3) (binary)",&el);
        }

        if(!count) {
            return;
        }

        if (type != 'd' && type != 'f') {
            ParseError("expected float or double array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * (type == 'd' ? 8 : 4));

        const uint32_t count3 = count / 3;
        out.reserve(count3);

        if (type == 'd') {
            const double* d = reinterpret_cast<const double*>(&buff[0]);
            for (unsigned int i = 0; i < count3; ++i, d += 3) {
                out.push_back(aiVector3D(static_cast<ai_real>(d[0]),
                    static_cast<ai_real>(d[1]),
                    static_cast<ai_real>(d[2])));
            }
            // for debugging
            /*for ( size_t i = 0; i < out.size(); i++ ) {
                aiVector3D vec3( out[ i ] );
                std::stringstream stream;
                stream << " vec3.x = " << vec3.x << " vec3.y = " << vec3.y << " vec3.z = " << vec3.z << std::endl;
                DefaultLogger::get()->info( stream.str() );
            }*/
        }
        else if (type == 'f') {
            const float* f = reinterpret_cast<const float*>(&buff[0]);
            for (unsigned int i = 0; i < count3; ++i, f += 3) {
                out.push_back(aiVector3D(f[0],f[1],f[2]));
            }
        }

        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    // may throw bad_alloc if the input is rubbish, but this need
    // not to be prevented - importing would fail but we wouldn't
    // crash since assimp handles this case properly.
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    if (a.Tokens().size() % 3 != 0) {
        ParseError("number of floats is not a multiple of three (3)",&el);
    }
    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        aiVector3D v;
        v.x = ParseTokenAsFloat(**it++);
        v.y = ParseTokenAsFloat(**it++);
        v.z = ParseTokenAsFloat(**it++);

        out.push_back(v);
    }
}